

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorLinearDriveline::Update
          (ChLinkMotorLinearDriveline *this,double mytime,bool update_assets)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ChBodyFrame *pCVar3;
  ChBodyFrame *pCVar4;
  element_type *peVar5;
  element_type *peVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ulong uVar15;
  byte bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ulong uVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  double dVar53;
  undefined1 auVar54 [16];
  double dVar55;
  ChVector<double> abs_shaftdir;
  ChVector<double> abs_shaft2_rotation_dir;
  double local_178;
  double dStack_170;
  double local_118;
  double dStack_110;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_a8;
  double dStack_a0;
  ChCoordsys<double> local_90;
  undefined8 local_58;
  double local_50;
  undefined8 local_48;
  ulong local_38;
  double local_30;
  ulong local_28;
  
  ChLinkMotorLinear::Update(&this->super_ChLinkMotorLinear,mytime,update_assets);
  (**(code **)(*(long *)&(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                         super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem + 0x1f8)
  )(&local_90,this);
  ChCoordsys<double>::TransformDirectionLocalToParent(&local_90,(ChVector<double> *)&VECT_X);
  pCVar3 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
           super_ChLinkMate.super_ChLink.Body2;
  pCVar4 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
           super_ChLinkMate.super_ChLink.Body1;
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       *(double *)
        ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       *(double *)
        ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       *(double *)
        ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar7 = vmovhps_avx(auVar23,(pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[0]);
  auVar8 = vmovhps_avx(auVar45,*(double *)
                                ((long)&(pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.
                                        Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                        .m_storage.m_data + 0x18));
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       *(double *)
        ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar9 = vmovhps_avx(auVar24,*(double *)
                                ((long)&(pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.
                                        Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                        .m_storage.m_data + 0x30));
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       *(double *)
        ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar10 = vmovhps_avx(auVar25,*(double *)
                                 ((long)&(pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>
                                         .Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                         .m_storage.m_data + 0x20));
  auVar11 = vmovhps_avx(auVar35,*(double *)
                                 ((long)&(pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>
                                         .Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                         .m_storage.m_data + 8));
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       *(double *)
        ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar12 = vmovhps_avx(auVar26,*(double *)
                                 ((long)&(pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>
                                         .Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                         .m_storage.m_data + 0x38));
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       *(double *)
        ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar13 = vmovhps_avx(auVar27,*(double *)
                                 ((long)&(pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>
                                         .Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                         .m_storage.m_data + 0x28));
  auVar14 = vmovhps_avx(auVar41,*(double *)
                                 ((long)&(pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>
                                         .Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                         .m_storage.m_data + 0x10));
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       *(double *)
        ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar23 = vmovhps_avx(auVar28,*(double *)
                                 ((long)&(pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>
                                         .Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                         .m_storage.m_data + 0x40));
  (**(code **)(*(long *)&(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                         super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem + 0x1f8)
  )(&local_90,this);
  dVar22 = local_90.pos.m_data[1] -
           (pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  dVar53 = local_90.pos.m_data[0] -
           (pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  dVar55 = local_90.pos.m_data[2] -
           (pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(double *)
                  ((long)&(pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x10);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar53;
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       dVar22 * *(double *)
                 ((long)&(pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x28);
  auVar1 = vfmadd231sd_fma(auVar46,auVar29,auVar1);
  auVar36._0_8_ =
       dVar22 * *(double *)
                 ((long)&(pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x18);
  auVar36._8_8_ =
       dVar22 * *(double *)
                 ((long)&(pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x20);
  auVar30._8_8_ = dVar53;
  auVar30._0_8_ = dVar53;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(double *)
                  ((long)&(pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x40);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar55;
  auVar25 = vfmadd231sd_fma(auVar1,auVar42,auVar2);
  auVar1 = vfmadd132pd_fma(auVar30,auVar36,
                           *(undefined1 (*) [16])
                            (pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array);
  auVar37._8_8_ = dVar55;
  auVar37._0_8_ = dVar55;
  auVar24 = vfmadd132pd_fma(auVar37,auVar1,
                            *(undefined1 (*) [16])
                             ((long)&(pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.
                                     Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                     m_storage.m_data + 0x30));
  pCVar3 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
           super_ChLinkMate.super_ChLink.Body2;
  (**(code **)(*(long *)&(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                         super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem + 0x1f8)
  )(&local_90,this);
  auVar17._8_8_ = local_58;
  auVar17._0_8_ = local_58;
  auVar21._8_8_ = local_48;
  auVar21._0_8_ = local_48;
  local_90.pos.m_data[1] =
       local_90.pos.m_data[1] -
       (pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  local_90.pos.m_data[0] =
       local_90.pos.m_data[0] -
       (pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  local_90.pos.m_data[2] =
       local_90.pos.m_data[2] -
       (pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  local_e8 = auVar10._0_8_;
  dStack_e0 = auVar10._8_8_;
  auVar50._0_8_ = local_50 * local_e8;
  auVar50._8_8_ = local_50 * dStack_e0;
  auVar1 = vfmadd231pd_fma(auVar50,auVar17,auVar11);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       *(double *)
        ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_90.pos.m_data[0];
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       local_90.pos.m_data[1] *
       *(double *)
        ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar2 = vfmadd231sd_fma(auVar47,auVar31,auVar10);
  auVar12 = vfmadd231pd_fma(auVar1,auVar21,auVar12);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       *(double *)
        ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar43._8_8_ = 0;
  auVar43._0_8_ = local_90.pos.m_data[2];
  auVar26 = vfmadd231sd_fma(auVar2,auVar43,auVar11);
  auVar38._0_8_ =
       local_90.pos.m_data[1] *
       *(double *)
        ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar38._8_8_ =
       local_90.pos.m_data[1] *
       *(double *)
        ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  local_118 = auVar8._0_8_;
  dStack_110 = auVar8._8_8_;
  auVar48._0_8_ = local_50 * local_118;
  auVar48._8_8_ = local_50 * dStack_110;
  local_f8 = auVar13._0_8_;
  dStack_f0 = auVar13._8_8_;
  auVar52._0_8_ = local_50 * local_f8;
  auVar52._8_8_ = local_50 * dStack_f0;
  auVar1 = vfmadd231pd_fma(auVar48,auVar17,auVar7);
  auVar2 = vfmadd231pd_fma(auVar52,auVar17,auVar14);
  dVar22 = auVar12._0_8_;
  auVar54._0_8_ = dVar22 * dVar22;
  auVar54._8_8_ = auVar12._8_8_ * auVar12._8_8_;
  auVar17 = vfmadd231pd_fma(auVar1,auVar21,auVar9);
  auVar23 = vfmadd231pd_fma(auVar2,auVar21,auVar23);
  auVar2 = vfmadd231pd_fma(auVar54,auVar17,auVar17);
  auVar1 = vshufpd_avx(auVar23,auVar23,1);
  auVar2 = vfmadd231pd_fma(auVar2,auVar23,auVar23);
  auVar10 = vsqrtpd_avx(auVar2);
  auVar18._8_8_ = 0x10000000000000;
  auVar18._0_8_ = 0x10000000000000;
  uVar15 = vcmppd_avx512vl(auVar10,auVar18,5);
  auVar2 = vshufpd_avx(auVar10,auVar10,1);
  dVar53 = 1.0 / auVar10._0_8_;
  dVar55 = 1.0 / auVar2._0_8_;
  uVar19 = (uVar15 & 3) >> 1;
  bVar16 = (byte)(uVar15 & 3);
  auVar2 = vshufpd_avx(auVar12,auVar12,1);
  auVar10 = vshufpd_avx(auVar17,auVar17,1);
  auVar32._8_8_ = local_90.pos.m_data[0];
  auVar32._0_8_ = local_90.pos.m_data[0];
  auVar11 = vfmadd132pd_fma(auVar32,auVar38,
                            *(undefined1 (*) [16])
                             (pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                             super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array);
  auVar39._8_8_ = local_90.pos.m_data[2];
  auVar39._0_8_ = local_90.pos.m_data[2];
  auVar11 = vfmadd132pd_fma(auVar39,auVar11,
                            *(undefined1 (*) [16])
                             ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.
                                     Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                     m_storage.m_data + 0x30));
  (**(code **)(*(long *)&(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                         super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem + 0x1f8)
  )(&local_90,this);
  ChCoordsys<double>::TransformDirectionLocalToParent(&local_90,&this->shaft2_rotation_dir);
  pCVar3 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
           super_ChLinkMate.super_ChLink.Body2;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_38;
  peVar5 = (this->innerconstraint1lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = local_28;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(double *)
                  ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x10);
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       local_30 *
       *(double *)
        ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar7 = vfmadd231sd_fma(auVar49,auVar33,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(double *)
                  ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 8);
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       local_30 *
       *(double *)
        ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar8 = vfmadd231sd_fma(auVar51,auVar33,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       local_30 *
       *(double *)
        ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar9 = vfmadd231sd_fma(auVar40,auVar33,auVar9);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       *(double *)
        ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar7 = vfmadd231sd_fma(auVar7,auVar44,auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       *(double *)
        ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar8 = vfmadd231sd_fma(auVar8,auVar44,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       *(double *)
        ((long)&(pCVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar9 = vfmadd231sd_fma(auVar9,auVar44,auVar14);
  (peVar5->shaft_dir).m_data[0] =
       (double)(uVar19 * (long)(auVar10._0_8_ * dVar55) +
               (ulong)!SUB81(uVar19,0) * 0x3ff0000000000000);
  (peVar5->shaft_dir).m_data[1] = (double)(uVar19 * (long)(auVar2._0_8_ * dVar55));
  (peVar5->shaft_dir).m_data[2] = (double)(uVar19 * (long)(auVar1._0_8_ * dVar55));
  local_a8 = auVar24._0_8_;
  dStack_a0 = auVar24._8_8_;
  (peVar5->shaft_pos).m_data[0] = local_a8;
  (peVar5->shaft_pos).m_data[1] = dStack_a0;
  (peVar5->shaft_pos).m_data[2] = auVar25._0_8_;
  peVar5 = (this->innerconstraint2lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar5->shaft_dir).m_data[0] =
       (double)((ulong)(bVar16 & 1) * (long)(auVar17._0_8_ * dVar53) +
               (ulong)!(bool)(bVar16 & 1) * 0x3ff0000000000000);
  (peVar5->shaft_dir).m_data[1] = (double)((ulong)(bVar16 & 1) * (long)(dVar22 * dVar53));
  (peVar5->shaft_dir).m_data[2] = (double)((ulong)(bVar16 & 1) * (long)(auVar23._0_8_ * dVar53));
  local_178 = auVar11._0_8_;
  dStack_170 = auVar11._8_8_;
  (peVar5->shaft_pos).m_data[0] = local_178;
  (peVar5->shaft_pos).m_data[1] = dStack_170;
  (peVar5->shaft_pos).m_data[2] = auVar26._0_8_;
  dVar53 = auVar8._0_8_;
  peVar6 = (this->innerconstraint2rot).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar53 * dVar53;
  auVar1 = vfmadd231sd_fma(auVar34,auVar9,auVar9);
  auVar1 = vfmadd231sd_fma(auVar1,auVar7,auVar7);
  auVar1 = vsqrtsd_avx(auVar1,auVar1);
  dVar22 = 1.0 / auVar1._0_8_;
  bVar20 = 2.2250738585072014e-308 <= auVar1._0_8_;
  (peVar6->shaft_dir).m_data[0] =
       (double)((ulong)bVar20 * (long)(auVar9._0_8_ * dVar22) + (ulong)!bVar20 * 0x3ff0000000000000)
  ;
  (peVar6->shaft_dir).m_data[1] = (double)((ulong)bVar20 * (long)(dVar53 * dVar22));
  (peVar6->shaft_dir).m_data[2] = (double)((ulong)bVar20 * (long)(auVar7._0_8_ * dVar22));
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::Update(double mytime, bool update_assets) {
    // Inherit parent class:
    ChLinkMotorLinear::Update(mytime, update_assets);

    // Update the direction of 1D-3D ChShaftBody constraints:
    ChVector<> abs_shaftdir = this->GetLinkAbsoluteCoords().TransformDirectionLocalToParent(VECT_X);
    ChVector<> shaftdir_b1 = this->Body1->TransformDirectionParentToLocal(abs_shaftdir);
    ChVector<> shaftdir_b2 = this->Body2->TransformDirectionParentToLocal(abs_shaftdir);
    ChVector<> shaftpos_b1 = this->Body1->TransformPointParentToLocal(this->GetLinkAbsoluteCoords().pos);
    ChVector<> shaftpos_b2 = this->Body2->TransformPointParentToLocal(this->GetLinkAbsoluteCoords().pos);
    ChVector<> abs_shaft2_rotation_dir =
        this->GetLinkAbsoluteCoords().TransformDirectionLocalToParent(this->shaft2_rotation_dir);
    ChVector<> shaftdir_b2rot = this->Body2->TransformDirectionParentToLocal(abs_shaft2_rotation_dir);

    innerconstraint1lin->SetShaftDirection(shaftdir_b1);
    innerconstraint1lin->SetShaftPos(shaftpos_b1);

    innerconstraint2lin->SetShaftDirection(shaftdir_b2);
    innerconstraint2lin->SetShaftPos(shaftpos_b2);

    innerconstraint2rot->SetShaftDirection(shaftdir_b2rot);
}